

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_opn2.cpp
# Opt level: O2

void __thiscall
OPN2::reset(OPN2 *this,int emulator,unsigned_long PCM_RATE,OPNFamily family,void *audioTickHandler)

{
  vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  *this_00;
  pointer pOVar1;
  pointer puVar2;
  pointer pAVar3;
  long *plVar4;
  YmFmOPN2 *this_01;
  byte bVar5;
  OPNChipBase *first;
  uint uVar6;
  size_t chip;
  ulong uVar7;
  long lVar8;
  long local_78;
  value_type local_48;
  
  clearChips(this);
  pOVar1 = (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
      super__Vector_impl_data._M_finish != pOVar1) {
    (this->m_insCache).super__Vector_base<OpnTimbre,_std::allocator<OpnTimbre>_>._M_impl.
    super__Vector_impl_data._M_finish = pOVar1;
  }
  puVar2 = (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar2) {
    (this->m_regLFOSens).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if ((emulator == 7) && (2 < this->m_numChips)) {
    this->m_numChips = 2;
  }
  this_00 = &this->m_chips;
  std::
  vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ::clear(this_00);
  local_48.m_p = (OPNChipBase *)0x0;
  local_48.m_counter = (size_t *)0x0;
  std::
  vector<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
  ::resize(this_00,(ulong)this->m_numChips,&local_48);
  AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::~AdlMIDI_SPtr(&local_48);
  this->m_loopEndHook = (_func_void_void_ptr *)0x0;
  this->m_loopEndHookData = (void *)0x0;
  this->m_loopStartHook = (_func_void_void_ptr *)0x0;
  this->m_loopStartHookData = (void *)0x0;
  local_78 = 0;
  for (uVar7 = 0;
      pAVar3 = (this->m_chips).
               super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->m_chips).
                            super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 4);
      uVar7 = uVar7 + 1) {
    switch(emulator) {
    case 0:
      this_01 = (YmFmOPN2 *)operator_new(0x40);
      MameOPN2::MameOPN2((MameOPN2 *)this_01,family);
      break;
    case 1:
      this_01 = (YmFmOPN2 *)operator_new(0x40);
      NukedOPN2::NukedOPN2((NukedOPN2 *)this_01,family,true);
      break;
    case 2:
      this_01 = (YmFmOPN2 *)operator_new(0x440);
      GensOPN2::GensOPN2((GensOPN2 *)this_01,family);
      break;
    case 3:
      this_01 = (YmFmOPN2 *)operator_new(0x1000);
      YmFmOPN2::YmFmOPN2(this_01,family);
      break;
    case 4:
      this_01 = (YmFmOPN2 *)operator_new(0x440);
      NP2OPNA<FM::OPNA>::NP2OPNA((NP2OPNA<FM::OPNA> *)this_01,family);
      break;
    case 5:
      this_01 = (YmFmOPN2 *)operator_new(0x440);
      MameOPNA::MameOPNA((MameOPNA *)this_01,family);
      break;
    case 6:
      this_01 = (YmFmOPN2 *)operator_new(0x58);
      YmFmOPNA::YmFmOPNA((YmFmOPNA *)this_01,family);
      break;
    case 7:
      this_01 = (YmFmOPN2 *)operator_new(0x4a0);
      if (uVar7 == 0) {
        first = (OPNChipBase *)0x0;
      }
      else {
        first = pAVar3->m_p;
      }
      VGMFileDumper::VGMFileDumper((VGMFileDumper *)this_01,family,(uint32_t)uVar7,first);
      if (uVar7 == 0) {
        this->m_loopStartHook = VGMFileDumper::loopStartHook;
        this->m_loopStartHookData = this_01;
        this->m_loopEndHook = VGMFileDumper::loopEndHook;
        this->m_loopEndHookData = this_01;
      }
      break;
    case 8:
      this_01 = (YmFmOPN2 *)operator_new(0x40);
      NukedOPN2::NukedOPN2((NukedOPN2 *)this_01,family,false);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi_opn2.cpp"
                    ,0x27e,"void OPN2::reset(int, unsigned long, OPNFamily, void *)");
    }
    AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::reset
              ((AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *)
               ((long)&((this->m_chips).
                        super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_p + local_78),
               (OPNChipBase *)this_01);
    (((OPNChipBaseT<NP2OPNA<FM::OPNA>_> *)
     &((OPNChipBaseBufferedT<GensOPN2,_256U> *)&this_01->super_OPNChipBaseT<YmFmOPN2>)->
      super_OPNChipBaseT<GensOPN2>)->super_OPNChipBase).m_id = (uint32_t)uVar7;
    uVar6 = (*(((OPNChipBaseT<NP2OPNA<FM::OPNA>_> *)
               &((OPNChipBaseBufferedT<GensOPN2,_256U> *)&this_01->super_OPNChipBaseT<YmFmOPN2>)->
                super_OPNChipBaseT<GensOPN2>)->super_OPNChipBase)._vptr_OPNChipBase[3])(this_01);
    (*(((OPNChipBaseT<NP2OPNA<FM::OPNA>_> *)
       &((OPNChipBaseBufferedT<GensOPN2,_256U> *)&this_01->super_OPNChipBaseT<YmFmOPN2>)->
        super_OPNChipBaseT<GensOPN2>)->super_OPNChipBase)._vptr_OPNChipBase[7])
              (this_01,PCM_RATE,(ulong)uVar6);
    if (this->m_runAtPcmRate == true) {
      (*(((OPNChipBaseT<NP2OPNA<FM::OPNA>_> *)
         &((OPNChipBaseBufferedT<GensOPN2,_256U> *)&this_01->super_OPNChipBaseT<YmFmOPN2>)->
          super_OPNChipBaseT<GensOPN2>)->super_OPNChipBase)._vptr_OPNChipBase[6])(this_01,1);
    }
    family = (*(((OPNChipBaseT<NP2OPNA<FM::OPNA>_> *)
                &((OPNChipBaseBufferedT<GensOPN2,_256U> *)&this_01->super_OPNChipBaseT<YmFmOPN2>)->
                 super_OPNChipBaseT<GensOPN2>)->super_OPNChipBase)._vptr_OPNChipBase[2])(this_01);
    local_78 = local_78 + 0x10;
  }
  this->m_chipFamily = family;
  uVar6 = this->m_numChips * 6;
  this->m_numChannels = uVar6;
  std::vector<OpnTimbre,_std::allocator<OpnTimbre>_>::resize
            (&this->m_insCache,(ulong)uVar6,(value_type)ZEXT1632(ZEXT816((ulong)0)));
  lVar8 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_regLFOSens,(ulong)this->m_numChannels,'\0');
  bVar5 = this->m_lfoFrequency & 7 | this->m_lfoEnable << 3;
  this->m_regLFOSetup = bVar5;
  for (uVar7 = 0; uVar7 < this->m_numChips; uVar7 = uVar7 + 1) {
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x22,bVar5);
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x27,0);
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x2b,0);
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,0);
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,1);
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,2);
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,4);
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,5);
    plVar4 = *(long **)((long)&((this_00->
                                super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m_p + lVar8);
    (**(code **)(*plVar4 + 0x58))(plVar4,0,0x28,6);
    lVar8 = lVar8 + 0x10;
  }
  silenceAll(this);
  if (this->m_loopStartHook != (_func_void_void_ptr *)0x0) {
    (*this->m_loopStartHook)(this->m_loopStartHookData);
  }
  return;
}

Assistant:

void OPN2::reset(int emulator, unsigned long PCM_RATE, OPNFamily family, void *audioTickHandler)
{
#if !defined(ADLMIDI_AUDIO_TICK_HANDLER)
    ADL_UNUSED(audioTickHandler);
#endif
    clearChips();
    m_insCache.clear();
    m_regLFOSens.clear();
#ifdef OPNMIDI_MIDI2VGM
    if(emulator == OPNMIDI_VGM_DUMPER && (m_numChips > 2))
        m_numChips = 2;// VGM Dumper can't work in multichip mode
#endif
    m_chips.clear();
    m_chips.resize(m_numChips, AdlMIDI_SPtr<OPNChipBase>());

#ifdef OPNMIDI_MIDI2VGM
    m_loopStartHook = NULL;
    m_loopStartHookData = NULL;
    m_loopEndHook = NULL;
    m_loopEndHookData = NULL;
#endif

    for(size_t i = 0; i < m_chips.size(); i++)
    {
        OPNChipBase *chip = NULL;

        switch(emulator)
        {
        default:
            assert(false);
            abort();
#ifndef OPNMIDI_DISABLE_MAME_EMULATOR
        case OPNMIDI_EMU_MAME:
            chip = new MameOPN2(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_NUKED_EMULATOR
        case OPNMIDI_EMU_NUKED_YM3438:
            chip = new NukedOPN2(family, true);
            break;
        case OPNMIDI_EMU_NUKED_YM2612:
            chip = new NukedOPN2(family, false);
            break;
#endif
#ifndef OPNMIDI_DISABLE_GENS_EMULATOR
        case OPNMIDI_EMU_GENS:
            chip = new GensOPN2(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_YMFM_EMULATOR
        case OPNMIDI_EMU_YMFM_OPN2:
            chip = new YmFmOPN2(family);
            break;
#endif
//#ifndef OPNMIDI_DISABLE_GX_EMULATOR
//        case OPNMIDI_EMU_GX:
//            chip = new GXOPN2(family);
//            break;
//#endif
#ifndef OPNMIDI_DISABLE_NP2_EMULATOR
        case OPNMIDI_EMU_NP2:
            chip = new NP2OPNA<>(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_MAME_2608_EMULATOR
        case OPNMIDI_EMU_MAME_2608:
            chip = new MameOPNA(family);
            break;
#endif
#ifndef OPNMIDI_DISABLE_YMFM_EMULATOR
        case OPNMIDI_EMU_YMFM_OPNA:
            chip = new YmFmOPNA(family);
            break;
#endif
//#ifndef OPNMIDI_DISABLE_PMDWIN_EMULATOR
//        case OPNMIDI_EMU_PMDWIN:
//            chip = new PMDWinOPNA(family);
//            break;
//#endif
#ifdef OPNMIDI_MIDI2VGM
        case OPNMIDI_VGM_DUMPER:
            chip = new VGMFileDumper(family, i, (i == 0 ? NULL : m_chips[0].get()));
            if(i == 0)//Set hooks for first chip only
            {
                m_loopStartHook = &VGMFileDumper::loopStartHook;
                m_loopStartHookData = chip;
                m_loopEndHook  = &VGMFileDumper::loopEndHook;
                m_loopEndHookData = chip;
            }
            break;
#endif
        }

        m_chips[i].reset(chip);
        chip->setChipId(static_cast<uint32_t>(i));
        chip->setRate(static_cast<uint32_t>(PCM_RATE), chip->nativeClockRate());

        if(m_runAtPcmRate)
            chip->setRunningAtPcmRate(true);

#if defined(ADLMIDI_AUDIO_TICK_HANDLER)
        chip->setAudioTickHandlerInstance(audioTickHandler);
#endif
        family = chip->family();
    }

    m_chipFamily = family;
    m_numChannels = m_numChips * 6;
    m_insCache.resize(m_numChannels,   m_emptyInstrument.op[0]);
    m_regLFOSens.resize(m_numChannels,    0);

    uint8_t regLFOSetup = (m_lfoEnable ? 8 : 0) | (m_lfoFrequency & 7);
    m_regLFOSetup = regLFOSetup;

    for(size_t chip = 0; chip < m_numChips; ++chip)
    {
        writeReg(chip, 0, 0x22, regLFOSetup);//push current LFO state
        writeReg(chip, 0, 0x27, 0x00);  //set Channel 3 normal mode
        writeReg(chip, 0, 0x2B, 0x00);  //Disable DAC
        //Shut up all channels
        writeReg(chip, 0, 0x28, 0x00); //Note Off 0 channel
        writeReg(chip, 0, 0x28, 0x01); //Note Off 1 channel
        writeReg(chip, 0, 0x28, 0x02); //Note Off 2 channel
        writeReg(chip, 0, 0x28, 0x04); //Note Off 3 channel
        writeReg(chip, 0, 0x28, 0x05); //Note Off 4 channel
        writeReg(chip, 0, 0x28, 0x06); //Note Off 5 channel
    }

    silenceAll();
#ifdef OPNMIDI_MIDI2VGM
    if(m_loopStartHook) // Post-initialization Loop Start hook (fix for loop edge passing clicks)
        m_loopStartHook(m_loopStartHookData);
#endif
}